

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O2

SynDoWhile * ParseDoWhile(ParseContext *ctx)

{
  Lexeme *begin;
  int iVar1;
  undefined4 extraout_var;
  SynBase *pSVar2;
  undefined4 extraout_var_00;
  SynDoWhile *this;
  Lexeme *end;
  IntrusiveList<SynBase> local_38;
  undefined4 extraout_var_01;
  
  begin = ctx->currentLexeme;
  if (begin->type == lex_do) {
    ctx->currentLexeme = begin + 1;
    local_38 = (IntrusiveList<SynBase>)ZEXT816(0);
    if (begin[1].type == lex_ofigure) {
      ctx->currentLexeme = begin + 2;
      local_38 = ParseExpressions(ctx);
      anon_unknown.dwarf_153727::CheckConsume(ctx,lex_cfigure,"ERROR: closing \'}\' not found");
    }
    else {
      pSVar2 = ParseExpression(ctx);
      if (pSVar2 == (SynBase *)0x0) {
        anon_unknown.dwarf_153727::Report
                  (ctx,ctx->currentLexeme,"ERROR: expression expected after \'do\'");
        iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
        pSVar2 = (SynBase *)CONCAT44(extraout_var,iVar1);
        SynError::SynError((SynError *)pSVar2,ctx->currentLexeme,ctx->currentLexeme);
      }
      IntrusiveList<SynBase>::push_back(&local_38,pSVar2);
    }
    anon_unknown.dwarf_153727::CheckConsume
              (ctx,lex_while,"ERROR: \'while\' expected after \'do\' statement");
    anon_unknown.dwarf_153727::CheckConsume(ctx,lex_oparen,"ERROR: \'(\' not found after \'while\'")
    ;
    pSVar2 = ParseAssignment(ctx);
    if (pSVar2 == (SynBase *)0x0) {
      anon_unknown.dwarf_153727::Report
                (ctx,ctx->currentLexeme,"ERROR: expression expected after \'while(\'");
      iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
      pSVar2 = (SynBase *)CONCAT44(extraout_var_00,iVar1);
      SynError::SynError((SynError *)pSVar2,ctx->currentLexeme,ctx->currentLexeme);
    }
    anon_unknown.dwarf_153727::CheckConsume
              (ctx,lex_cparen,
               "ERROR: closing \')\' not found after expression in \'while\' statement");
    anon_unknown.dwarf_153727::CheckConsume
              (ctx,lex_semicolon,"ERROR: while(...) should be followed by \';\'");
    iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x58);
    this = (SynDoWhile *)CONCAT44(extraout_var_01,iVar1);
    end = ParseContext::Previous(ctx);
    SynDoWhile::SynDoWhile(this,begin,end,local_38,pSVar2);
  }
  else {
    this = (SynDoWhile *)0x0;
  }
  return this;
}

Assistant:

SynDoWhile* ParseDoWhile(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	if(ctx.Consume(lex_do))
	{
		IntrusiveList<SynBase> expressions;

		if(ctx.Consume(lex_ofigure))
		{
			expressions = ParseExpressions(ctx);

			CheckConsume(ctx, lex_cfigure, "ERROR: closing '}' not found");
		}
		else if(SynBase *body = ParseExpression(ctx))
		{
			expressions.push_back(body);
		}
		else
		{
			Report(ctx, ctx.Current(), "ERROR: expression expected after 'do'");

			expressions.push_back(new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current()));
		}

		CheckConsume(ctx, lex_while, "ERROR: 'while' expected after 'do' statement");

		CheckConsume(ctx, lex_oparen, "ERROR: '(' not found after 'while'");

		SynBase *condition = ParseAssignment(ctx);

		if(!condition)
		{
			Report(ctx, ctx.Current(), "ERROR: expression expected after 'while('");

			condition = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
		}

		CheckConsume(ctx, lex_cparen, "ERROR: closing ')' not found after expression in 'while' statement");

		CheckConsume(ctx, lex_semicolon, "ERROR: while(...) should be followed by ';'");

		return new (ctx.get<SynDoWhile>()) SynDoWhile(start, ctx.Previous(), expressions, condition);
	}

	return NULL;
}